

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O2

void format_message(char *msg,unsigned_long options)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  
  if ((options & 1) == 0) {
    CTcHostIfc::print_err(G_hostifc,"%s",msg);
    return;
  }
  CTcHostIfc::print_err(G_hostifc,"\n");
  cVar3 = *msg;
  bVar8 = cVar3 == '\0';
  do {
    if (bVar8) {
      return;
    }
    pcVar6 = (char *)0x0;
    pcVar5 = msg;
    do {
      while( true ) {
        pcVar7 = pcVar5;
        if (cVar3 == ' ') {
          pcVar6 = pcVar7;
        }
        pcVar5 = pcVar7;
        if ((cVar3 == '\0') ||
           ((0x4e < (long)pcVar7 - (long)msg && (pcVar5 = pcVar6, pcVar6 != (char *)0x0)))) break;
        cVar3 = pcVar7[1];
        pcVar5 = pcVar7 + 1;
      }
      lVar2 = (long)pcVar5 - (long)msg;
      pcVar6 = pcVar5;
      do {
        lVar4 = lVar2;
        pcVar6 = pcVar6 + -1;
        if (pcVar5 <= msg) break;
        pcVar1 = pcVar5 + -1;
        pcVar5 = pcVar5 + -1;
        lVar2 = lVar4 + -1;
      } while (*pcVar1 == ' ');
      CTcHostIfc::print_err(G_hostifc,"%.*s\n",lVar4);
      msg = pcVar6;
      do {
        cVar3 = msg[1];
        msg = msg + 1;
      } while (cVar3 == ' ');
      pcVar6 = msg;
      pcVar5 = msg;
    } while (*pcVar7 != '\0');
    bVar8 = true;
    cVar3 = '\0';
    msg = pcVar7;
  } while( true );
}

Assistant:

static void format_message(const char *msg, unsigned long options)
{
    /*
     *   if we're in verbose mode, word-wrap to 80 columns; otherwise just
     *   print it as-is 
     */
    if ((options & TCMAIN_ERR_VERBOSE) != 0)
    {
        const char *p;
        const int line_wid = 79;

        /* start on a new line, to skip any prefix text */
        G_hostifc->print_err("\n");

        /* word-wrap to 80 columns */
        for (p = msg ; *p != '\0' ; )
        {
            const char *start;
            const char *sp;

            /* find the next word break */
            for (sp = 0, start = p ; ; )
            {
                /* if this is a space, note it */
                if (*p == ' ')
                    sp = p;

                /* 
                 *   if we're at the end of the line, or we're over the line
                 *   width and we found a space, break here 
                 */
                if (*p == '\0' || (p - start >= line_wid && sp != 0))
                {
                    /* if we've reached the end, print the rest */
                    if (*p == '\0')
                        sp = p;

                    /* trim off trailing spaces */
                    for ( ; sp > start && *(sp-1) == ' ' ; --sp) ;

                    /* show this part */
                    G_hostifc->print_err("%.*s\n", sp - start, start);

                    /* skip leading spaces */
                    for ( ; *sp == ' ' ; ++sp) ;

                    /* if this is the end of the line, we're done */
                    if (*p == '\0')
                        break;

                    /* start over here */
                    start = p = sp;
                }
                else
                {
                    /* this one fits - skip it */
                    ++p;
                }
            }
        }
    }
    else
    {
        /* display it */
        G_hostifc->print_err("%s", msg);
    }
}